

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  PolicyMap *pm;
  cmMakefile *pcVar2;
  cmTarget *pcVar3;
  cmTargetInternalPointer *pcVar4;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  cmTargetInternals *__s;
  char *pcVar8;
  undefined **ppuVar9;
  _Alloc_hider s;
  cmStringRange cVar10;
  cmBacktraceRange cVar11;
  string configUpper;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  undefined1 local_110 [48];
  cmTarget *local_e0;
  allocator local_d1;
  string local_d0;
  cmTargetInternalPointer *local_b0;
  string local_a8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_88;
  cmListFileBacktrace *local_80;
  string *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->SystemIncludeDirectories;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_78 = (string *)&this->Name;
  local_58 = &(this->Name).field_2;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] = 0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)local_58;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->InstallPath).field_2;
  (this->InstallPath)._M_dataplus._M_p = (pointer)local_60;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)local_68;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  local_70 = &this->LinkDirectories;
  memset(local_70,0,0x90);
  local_e0 = this;
  __s = (cmTargetInternals *)operator_new(0x120);
  local_b0 = &this->Internal;
  memset(__s,0,0x120);
  (this->Internal).Pointer = __s;
  local_80 = &this->Backtrace;
  cmListFileBacktrace::cmListFileBacktrace(local_80);
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  std::__cxx11::string::_M_assign(local_78);
  local_e0->TargetTypeValue = type;
  local_e0->Makefile = mf;
  local_e0->HaveInstallRule = false;
  local_e0->DLLPlatform = false;
  local_e0->IsAndroid = false;
  local_e0->IsImportedTarget = vis - VisibilityImported < 2;
  local_e0->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  local_e0->BuildInterfaceIncludesAppended = false;
  local_e0->RecordDependencies = type - STATIC_LIBRARY < 3;
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"WIN32","");
  bVar5 = cmMakefile::IsOn(mf,(string *)local_110);
  if (bVar5) {
    local_e0->DLLPlatform = true;
  }
  else {
    pcVar2 = local_e0->Makefile;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CYGWIN","");
    bVar5 = cmMakefile::IsOn(pcVar2,&local_d0);
    if (bVar5) {
      local_e0->DLLPlatform = true;
    }
    else {
      pcVar2 = local_e0->Makefile;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MINGW","");
      bVar5 = cmMakefile::IsOn(pcVar2,&local_a8);
      local_e0->DLLPlatform = bVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  pcVar2 = local_e0->Makefile;
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CMAKE_SYSTEM_NAME","");
  pcVar8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_110);
  iVar6 = strcmp(pcVar8,"Android");
  local_e0->IsAndroid = iVar6 == 0;
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (local_e0->TargetTypeValue != UTILITY) {
    if (local_e0->TargetTypeValue != INTERFACE_LIBRARY) {
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_API","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_API_MIN","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_ARCH","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_STL_TYPE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_SKIP_ANT_STEP","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_PROCESS_MAX","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_PROGUARD","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_PROGUARD_CONFIG_PATH","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_SECURE_PROPS_PATH","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_NATIVE_LIB_DIRECTORIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_JAVA_SOURCE_DIR","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_JAR_DIRECTORIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_JAR_DEPENDENCIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_ASSETS_DIRECTORIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"BUILD_RPATH","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"INSTALL_NAME_DIR","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"INSTALL_RPATH","");
      SetPropertyDefault(local_e0,(string *)local_110,"");
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"INSTALL_RPATH_USE_LINK_PATH","");
      SetPropertyDefault(local_e0,(string *)local_110,"OFF");
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"INTERPROCEDURAL_OPTIMIZATION","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"SKIP_BUILD_RPATH","");
      SetPropertyDefault(local_e0,(string *)local_110,"OFF");
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"BUILD_WITH_INSTALL_RPATH","");
      SetPropertyDefault(local_e0,(string *)local_110,"OFF");
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"ARCHIVE_OUTPUT_DIRECTORY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"LIBRARY_OUTPUT_DIRECTORY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"RUNTIME_OUTPUT_DIRECTORY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"PDB_OUTPUT_DIRECTORY","")
      ;
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"COMPILE_PDB_OUTPUT_DIRECTORY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Fortran_FORMAT","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"Fortran_MODULE_DIRECTORY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"GNUtoMS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"OSX_ARCHITECTURES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"IOS_INSTALL_COMBINED","")
      ;
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTOMOC","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTOUIC","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTORCC","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"AUTOMOC_DEPEND_FILTERS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTOMOC_MOC_OPTIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTOUIC_OPTIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTOUIC_SEARCH_PATHS","")
      ;
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"AUTORCC_OPTIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"LINK_DEPENDS_NO_SHARED","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"LINK_INTERFACE_LIBRARIES","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"WIN32_EXECUTABLE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"MACOSX_BUNDLE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"MACOSX_RPATH","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"BUILD_WITH_INSTALL_NAME_DIR","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_CLANG_TIDY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_COMPILER_LAUNCHER","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_CPPLINT","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"C_INCLUDE_WHAT_YOU_USE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"LINK_WHAT_YOU_USE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_STANDARD","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_STANDARD_REQUIRED","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_EXTENSIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CXX_CLANG_TIDY","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CXX_COMPILER_LAUNCHER","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CXX_CPPLINT","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CXX_INCLUDE_WHAT_YOU_USE","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CXX_STANDARD","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CXX_STANDARD_REQUIRED","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CXX_EXTENSIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CUDA_STANDARD","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CUDA_STANDARD_REQUIRED","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CUDA_EXTENSIONS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CUDA_COMPILER_LAUNCHER","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"LINK_SEARCH_START_STATIC","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"LINK_SEARCH_END_STATIC","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (local_e0->TargetTypeValue == UTILITY) goto LAB_002a3e46;
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"NO_SYSTEM_FROM_IMPORTED","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
  }
LAB_002a3e46:
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  cmMakefile::GetConfigurations
            (&local_50,mf,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((local_e0->TargetTypeValue != UTILITY) &&
     (local_a8._M_dataplus._M_p != (pointer)local_a8._M_string_length)) {
    s._M_p = local_a8._M_dataplus._M_p;
    do {
      cmsys::SystemTools::UpperCase((string *)local_110,(string *)s._M_p);
      ppuVar9 = &PTR_anon_var_dwarf_267c4f_00686108;
      pcVar8 = "ARCHIVE_OUTPUT_DIRECTORY_";
      do {
        if (local_e0->TargetTypeValue == INTERFACE_LIBRARY) {
          iVar6 = strcmp(pcVar8,"MAP_IMPORTED_CONFIG_");
          if (iVar6 == 0) goto LAB_002a3efc;
        }
        else {
LAB_002a3efc:
          std::__cxx11::string::string((string *)&local_d0,pcVar8,&local_d1);
          std::__cxx11::string::_M_append((char *)&local_d0,local_110._0_8_);
          SetPropertyDefault(local_e0,&local_d0,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar8 = *ppuVar9;
        ppuVar9 = ppuVar9 + 1;
      } while (pcVar8 != (char *)0x0);
      if ((local_e0->TargetTypeValue != EXECUTABLE) &&
         (local_e0->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&local_d0,(string *)s._M_p);
        std::__cxx11::string::append((char *)&local_d0);
        SetPropertyDefault(local_e0,&local_d0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      s._M_p = s._M_p + 0x20;
    } while (s._M_p != (pointer)local_a8._M_string_length);
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_110,local_e0->Makefile);
  cmListFileBacktrace::operator=(local_80,(cmListFileBacktrace *)local_110);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_110);
  pcVar3 = local_e0;
  if (local_e0->IsImportedTarget == false) {
    cVar10 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(local_e0->Makefile);
    cVar11 = cmMakefile::GetIncludeDirectoriesBacktraces(pcVar3->Makefile);
    pcVar4 = local_b0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_b0->Pointer,
               (local_b0->Pointer->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar10.Begin._M_current._M_current,
               cVar10.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar4->Pointer->IncludeDirectoriesBacktraces,
               (pcVar4->Pointer->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar11.Begin._M_current._M_current,
               cVar11.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_110,&(local_e0->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (local_88,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_110._24_8_,(_Base_ptr)(local_110 + 8));
    pcVar3 = local_e0;
    cVar10 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(local_e0->Makefile);
    cVar11 = cmMakefile::GetCompileOptionsBacktraces(pcVar3->Makefile);
    pcVar4 = local_b0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_b0->Pointer->CompileOptionsEntries,
               (local_b0->Pointer->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar10.Begin._M_current._M_current,
               cVar10.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar4->Pointer->CompileOptionsBacktraces,
               (pcVar4->Pointer->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar11.Begin._M_current._M_current,
               cVar11.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_110);
  }
  TVar7 = local_e0->TargetTypeValue;
  if ((TVar7 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"C_VISIBILITY_PRESET","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CXX_VISIBILITY_PRESET","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CUDA_VISIBILITY_PRESET","")
    ;
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"VISIBILITY_INLINES_HIDDEN","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    TVar7 = local_e0->TargetTypeValue;
    if (TVar7 == EXECUTABLE) {
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ANDROID_GUI","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,"CROSSCOMPILING_EMULATOR","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"ENABLE_EXPORTS","");
      SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      TVar7 = local_e0->TargetTypeValue;
    }
  }
  if ((TVar7 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"POSITION_INDEPENDENT_CODE","");
    SetProperty(local_e0,(string *)local_110,"True");
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    TVar7 = local_e0->TargetTypeValue;
  }
  if ((TVar7 & ~SHARED_LIBRARY) == EXECUTABLE) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    TVar7 = local_e0->TargetTypeValue;
  }
  if ((TVar7 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"POSITION_INDEPENDENT_CODE","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
  }
  pm = &local_e0->PolicyMap;
  cmMakefile::RecordPolicies(local_e0->Makefile,pm);
  TVar7 = local_e0->TargetTypeValue;
  if (TVar7 == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(pm,CMP0022,NEW);
    TVar7 = local_e0->TargetTypeValue;
    if (TVar7 == INTERFACE_LIBRARY) goto LAB_002a4559;
  }
  if (TVar7 != UTILITY) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"JOB_POOL_COMPILE","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"JOB_POOL_LINK","");
    SetPropertyDefault(local_e0,(string *)local_110,(char *)0x0);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
  }
LAB_002a4559:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // only add dependency information for library targets
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY) {
    this->RecordDependencies = true;
  } else {
    this->RecordDependencies = false;
  }

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    (this->Makefile->IsOn("WIN32") || this->Makefile->IsOn("CYGWIN") ||
     this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_API_MIN", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ARCH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_STL_TYPE", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", CM_NULLPTR);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_FORMAT", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("GNUtoMS", CM_NULLPTR);
    this->SetPropertyDefault("OSX_ARCHITECTURES", CM_NULLPTR);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", CM_NULLPTR);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", CM_NULLPTR);
    this->SetPropertyDefault("WIN32_EXECUTABLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_BUNDLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("C_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("C_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("C_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CXX_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", CM_NULLPTR);
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    const char* configProps[] = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_", CM_NULLPTR
    };
    for (std::vector<std::string>::iterator ci = configNames.begin();
         ci != configNames.end(); ++ci) {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for (const char** p = configProps; *p; ++p) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, CM_NULLPTR);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, CM_NULLPTR);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(), parentOptions.begin(),
      parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(), parentOptionsBts.begin(),
      parentOptionsBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", CM_NULLPTR);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", CM_NULLPTR);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", CM_NULLPTR);
    this->SetPropertyDefault("ENABLE_EXPORTS", CM_NULLPTR);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", CM_NULLPTR);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", CM_NULLPTR);
    this->SetPropertyDefault("JOB_POOL_LINK", CM_NULLPTR);
  }
}